

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2mem.cpp
# Opt level: O3

float vstr_to_float(char *vstr)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  char *p;
  char *pcVar10;
  float fVar11;
  double dVar12;
  double dVar13;
  
  bVar2 = *vstr;
  if ((bVar2 == 0x2d) || (bVar3 = bVar2, bVar2 == 0x2b)) {
    pbVar1 = (byte *)(vstr + 1);
    vstr = vstr + 1;
    bVar3 = *pbVar1;
  }
  uVar5 = (uint)bVar3;
  uVar7 = (int)(char)bVar3 - 0x30;
  dVar12 = 0.0;
  if (uVar7 < 10) {
    uVar8 = 0;
    do {
      uVar8 = uVar7 + uVar8 * 10;
      uVar5 = (uint)vstr[1];
      vstr = vstr + 1;
      uVar7 = uVar5 - 0x30;
    } while (uVar7 < 10);
    dVar12 = (double)uVar8;
  }
  if ((char)uVar5 == '.') {
    uVar5 = (uint)vstr[1];
    vstr = vstr + 1;
    uVar7 = uVar5 - 0x30;
    if (uVar7 < 10) {
      uVar8 = 1;
      uVar9 = 0;
      do {
        uVar9 = uVar7 + uVar9 * 10;
        uVar8 = uVar8 * 10;
        uVar5 = (uint)vstr[1];
        vstr = vstr + 1;
        uVar7 = uVar5 - 0x30;
      } while (uVar7 < 10);
      dVar13 = (double)uVar9 / (double)uVar8;
    }
    else {
      dVar13 = 0.0;
    }
    dVar12 = dVar12 + dVar13;
  }
  if ((uVar5 & 0xff | 0x20) == 0x65) {
    cVar4 = vstr[1];
    if ((cVar4 == '-') || (cVar4 == '+')) {
      pcVar10 = vstr + 2;
      cVar6 = vstr[2];
    }
    else {
      pcVar10 = vstr + 1;
      cVar6 = cVar4;
    }
    uVar7 = (int)cVar6 - 0x30;
    if (uVar7 < 10) {
      uVar5 = 0;
      do {
        pcVar10 = pcVar10 + 1;
        uVar5 = uVar7 + uVar5 * 10;
        uVar7 = (int)*pcVar10 - 0x30;
      } while (uVar7 < 10);
      dVar13 = 1.0;
      for (; 7 < uVar5; uVar5 = uVar5 - 8) {
        dVar13 = dVar13 * 100000000.0;
      }
      for (; uVar5 != 0; uVar5 = uVar5 - 1) {
        dVar13 = dVar13 * 10.0;
      }
    }
    else {
      dVar13 = 1.0;
    }
    if (cVar4 == '-') {
      dVar12 = dVar12 / dVar13;
    }
    else {
      dVar12 = dVar12 * dVar13;
    }
  }
  fVar11 = (float)dVar12;
  if (bVar2 == 0x2d) {
    fVar11 = -fVar11;
  }
  return fVar11;
}

Assistant:

static float vstr_to_float(const char vstr[16])
{
    double v = 0.0;

    const char* p = vstr;

    // sign
    bool sign = *p != '-';
    if (*p == '+' || *p == '-')
    {
        p++;
    }

    // digits before decimal point or exponent
    unsigned int v1 = 0;
    while (isdigit(*p))
    {
        v1 = v1 * 10 + (*p - '0');
        p++;
    }

    v = (double)v1;

    // digits after decimal point
    if (*p == '.')
    {
        p++;

        unsigned int pow10 = 1;
        unsigned int v2 = 0;

        while (isdigit(*p))
        {
            v2 = v2 * 10 + (*p - '0');
            pow10 *= 10;
            p++;
        }

        v += v2 / (double)pow10;
    }

    // exponent
    if (*p == 'e' || *p == 'E')
    {
        p++;

        // sign of exponent
        bool fact = *p != '-';
        if (*p == '+' || *p == '-')
        {
            p++;
        }

        // digits of exponent
        unsigned int expon = 0;
        while (isdigit(*p))
        {
            expon = expon * 10 + (*p - '0');
            p++;
        }

        double scale = 1.0;
        while (expon >= 8)
        {
            scale *= 1e8;
            expon -= 8;
        }
        while (expon > 0)
        {
            scale *= 10.0;
            expon -= 1;
        }

        v = fact ? v * scale : v / scale;
    }

    //     fprintf(stderr, "v = %f\n", v);
    return sign ? (float)v : (float)-v;
}